

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_list.c
# Opt level: O0

opj_procedure_list_t * opj_procedure_list_create(void)

{
  opj_procedure *pp_Var1;
  opj_procedure_list_t *l_validation;
  
  l_validation = (opj_procedure_list_t *)opj_calloc(1,0x10);
  if (l_validation == (opj_procedure_list_t *)0x0) {
    l_validation = (opj_procedure_list_t *)0x0;
  }
  else {
    l_validation->m_nb_max_procedures = 10;
    pp_Var1 = (opj_procedure *)opj_calloc(10,8);
    l_validation->m_procedures = pp_Var1;
    if (l_validation->m_procedures == (opj_procedure *)0x0) {
      opj_free(l_validation);
      l_validation = (opj_procedure_list_t *)0x0;
    }
  }
  return l_validation;
}

Assistant:

opj_procedure_list_t *  opj_procedure_list_create()
{
    /* memory allocation */
    opj_procedure_list_t * l_validation = (opj_procedure_list_t *) opj_calloc(1,
                                          sizeof(opj_procedure_list_t));
    if (! l_validation) {
        return 00;
    }
    /* initialization */
    l_validation->m_nb_max_procedures = OPJ_VALIDATION_SIZE;
    l_validation->m_procedures = (opj_procedure*)opj_calloc(OPJ_VALIDATION_SIZE,
                                 sizeof(opj_procedure));
    if (! l_validation->m_procedures) {
        opj_free(l_validation);
        return 00;
    }
    return l_validation;
}